

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem-C-API.cpp
# Opt level: O0

llb_buildsystem_command_result_t
anon_unknown.dwarf_1b8a13::get_command_result(ProcessStatus commandResult)

{
  llb_buildsystem_command_result_t local_c;
  ProcessStatus commandResult_local;
  
  switch(commandResult) {
  case Succeeded:
    local_c = llb_buildsystem_command_result_succeeded;
    break;
  case Failed:
    local_c = llb_buildsystem_command_result_failed;
    break;
  case Cancelled:
    local_c = llb_buildsystem_command_result_cancelled;
    break;
  case Skipped:
    local_c = llb_buildsystem_command_result_skipped;
    break;
  default:
    __assert_fail("0 && \"unknown command result\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/products/libllbuild/BuildSystem-C-API.cpp"
                  ,0xab,
                  "llb_buildsystem_command_result_t (anonymous namespace)::get_command_result(ProcessStatus)"
                 );
  }
  return local_c;
}

Assistant:

llb_buildsystem_command_result_t get_command_result(ProcessStatus commandResult) {
  switch (commandResult) {
    case ProcessStatus::Succeeded:
      return llb_buildsystem_command_result_succeeded;
    case ProcessStatus::Cancelled:
      return llb_buildsystem_command_result_cancelled;
    case ProcessStatus::Failed:
      return llb_buildsystem_command_result_failed;
    case ProcessStatus::Skipped:
      return llb_buildsystem_command_result_skipped;
    default:
      assert(0 && "unknown command result");
      break;
  }
  return llb_buildsystem_command_result_failed;
}